

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::mutateClusters(TParameters *params,TClusters *clusters)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  value_type old;
  int idx;
  int i;
  int n;
  undefined4 local_18;
  
  sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  for (local_18 = 0; local_18 < 1; local_18 = local_18 + 1) {
    iVar3 = rand();
    iVar3 = iVar3 % (int)sVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar3);
    iVar1 = *pvVar6;
    do {
      iVar4 = rand();
      iVar2 = *(int *)(in_RDI + 4);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar3);
      *pvVar6 = iVar4 % (iVar2 + -1) + 1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar3);
    } while (*pvVar6 == iVar1);
  }
  return true;
}

Assistant:

bool mutateClusters(const TParameters & params, TClusters & clusters) {
        int n = clusters.size();

        for (int i = 0; i < 1; ++i) {
            int idx = rand()%n;

            auto old = clusters[idx];
            do {
                clusters[idx] = 1 + rand()%(params.maxClusters - 1);
            } while (clusters[idx] == old);
        }

        return true;
    }